

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

void __thiscall Kernel::Inference::initMany(Inference *this,InferenceRule r,UnitList *premises)

{
  UnitInputType UVar1;
  bool bVar2;
  List<Kernel::Unit_*> *this_00;
  Unit *this_01;
  byte *pbVar3;
  List<Kernel::Unit_*> *in_RDX;
  ulong *in_RDI;
  Inference *unaff_retaddr;
  Inference *inf;
  UnitList *it;
  InferenceRule in_stack_ffffffffffffffbe;
  UnitInputType in_stack_ffffffffffffffbf;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  uchar local_2a;
  uchar local_29;
  Inference *local_28;
  
  initDefault((Inference *)
              CONCAT17(in_stack_ffffffffffffffc7,
                       CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
              in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe);
  *in_RDI = *in_RDI & 0xfffffffffffffffc | 1;
  in_RDI[3] = (ulong)in_RDX;
  in_RDI[4] = 0;
  for (this_00 = in_RDX; this_00 != (List<Kernel::Unit_*> *)0x0;
      this_00 = Lib::List<Kernel::Unit_*>::tail(this_00)) {
    Lib::List<Kernel::Unit_*>::head(this_00);
    Unit::incRefCnt((Unit *)CONCAT17(in_stack_ffffffffffffffc7,
                                     CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)))
    ;
  }
  computeTheoryRunningSums((Inference *)0x0);
  if (in_RDX == (List<Kernel::Unit_*> *)0x0) {
    bVar2 = isTheoryAxiom((Inference *)
                          CONCAT17(in_stack_ffffffffffffffc7,
                                   CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
    *in_RDI = *in_RDI & 0xfffffffffffdffff | (ulong)bVar2 << 0x11;
    bVar2 = isCombinatorAxiom((Inference *)0x85e80c);
    *in_RDI = *in_RDI & 0xfffffffffffbffff | (ulong)bVar2 << 0x12;
    bVar2 = isProxyAxiom((Inference *)0x85e836);
    *in_RDI = *in_RDI & 0xfffffffffff7ffff | (ulong)bVar2 << 0x13;
    bVar2 = true;
    if ((*in_RDI >> 0x12 & 1) == 0) {
      bVar2 = (*in_RDI >> 0x13 & 1) != 0;
    }
    *in_RDI = *in_RDI & 0xffffffffffefffff | (ulong)bVar2 << 0x14;
  }
  else {
    *in_RDI = *in_RDI & 0xfffffffffffdffff | 0x20000;
    *in_RDI = *in_RDI & 0xfffffffffffbffff | 0x40000;
    *in_RDI = *in_RDI & 0xfffffffffff7ffff | 0x80000;
    *in_RDI = *in_RDI & 0xffffffffffefffff | 0x100000;
    for (; in_RDX != (List<Kernel::Unit_*> *)0x0; in_RDX = Lib::List<Kernel::Unit_*>::tail(in_RDX))
    {
      this_01 = Lib::List<Kernel::Unit_*>::head(in_RDX);
      local_28 = Unit::inference(this_01);
      inputType(local_28);
      UVar1 = getInputType(AXIOM,AXIOM);
      *in_RDI = *in_RDI & 0xffffffffffffffe3 | ((ulong)UVar1 & 7) << 2;
      bVar2 = isPureTheoryDescendant(local_28);
      *in_RDI = *in_RDI & 0xfffffffffffdffff |
                (ulong)(((byte)(*in_RDI >> 0x11) & 1 & bVar2) != 0) << 0x11;
      bVar2 = isCombAxiomsDescendant(local_28);
      *in_RDI = *in_RDI & 0xfffffffffffbffff |
                (ulong)((uint)(*in_RDI >> 0x12) & 1 & (uint)bVar2) << 0x12;
      bVar2 = isProxyAxiomsDescendant(local_28);
      *in_RDI = *in_RDI & 0xfffffffffff7ffff |
                (ulong)((uint)(*in_RDI >> 0x13) & 1 & (uint)bVar2) << 0x13;
      bVar2 = isHolAxiomsDescendant(local_28);
      *in_RDI = *in_RDI & 0xffffffffffefffff |
                (ulong)((uint)(*in_RDI >> 0x14) & 1 & (uint)bVar2) << 0x14;
      local_29 = (uchar)(*in_RDI >> 0x20);
      local_2a = getSineLevel(local_28);
      pbVar3 = std::min<unsigned_char>(&local_29,&local_2a);
      *in_RDI = *in_RDI & 0xffffff00ffffffff | (ulong)*pbVar3 << 0x20;
    }
  }
  updateStatistics(unaff_retaddr);
  return;
}

Assistant:

void Inference::initMany(InferenceRule r, UnitList* premises)
{
  initDefault(UnitInputType::AXIOM /* the minimal element; we later compute maximum over premises*/,r);

  _kind = Kind::INFERENCE_MANY;
  _ptr1 = premises;
  _ptr2 = nullptr;

  UnitList* it= premises;
  while(it) {
    it->head()->incRefCnt();
    it=it->tail();
  }

  computeTheoryRunningSums();

  if (premises) {
    _isPureTheoryDescendant = true;
    _combAxiomsDescendant = true;
    _proxyAxiomsDescendant = true;
    _holAxiomsDescendant = true;
    it=premises;
    while(it) {
      const Inference& inf = it->head()->inference();
      _inputType = getInputType(_inputType,inf.inputType());
      _isPureTheoryDescendant &= inf.isPureTheoryDescendant();
      _combAxiomsDescendant &= inf.isCombAxiomsDescendant();
      _proxyAxiomsDescendant &= inf.isProxyAxiomsDescendant();
      _holAxiomsDescendant &= inf.isHolAxiomsDescendant();
      _sineLevel = min(_sineLevel,inf.getSineLevel());
      it=it->tail();
    }
  } else {
    _isPureTheoryDescendant = isTheoryAxiom();
    _combAxiomsDescendant = isCombinatorAxiom();
    _proxyAxiomsDescendant = isProxyAxiom();
    _holAxiomsDescendant = _combAxiomsDescendant || _proxyAxiomsDescendant;
  }

  updateStatistics();
}